

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

void __thiscall
TPZBlockDiagonal<double>::TPZBlockDiagonal(TPZBlockDiagonal<double> *this,TPZVec<int> *blocksize)

{
  TPZVec<int> *in_RDI;
  TPZBlockDiagonal<double> *unaff_retaddr;
  TPZMatrix<double> *in_stack_ffffffffffffffc0;
  TPZVec<double> *this_00;
  TPZVec<int> *blocksize_00;
  
  blocksize_00 = in_RDI;
  TPZRegisterClassId::TPZRegisterClassId<TPZBlockDiagonal<double>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  *(undefined8 *)((long)&in_RDI->fStore + 2) = 0;
  *(undefined8 *)((long)&in_RDI->fNElements + 2) = 0;
  in_RDI->_vptr_TPZVec = (_func_int **)0x0;
  in_RDI->fStore = (int *)0x0;
  TPZMatrix<double>::TPZMatrix(in_stack_ffffffffffffffc0,&in_RDI->_vptr_TPZVec);
  in_RDI->_vptr_TPZVec = (_func_int **)&PTR__TPZBlockDiagonal_023f0d28;
  this_00 = (TPZVec<double> *)(in_RDI + 1);
  TPZVec<double>::TPZVec(this_00);
  TPZVec<long>::TPZVec((TPZVec<long> *)this_00,(int64_t)in_RDI,(long *)(in_RDI + 2));
  TPZVec<int>::TPZVec(in_RDI + 3);
  Initialize(unaff_retaddr,blocksize_00);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksize)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fStorage(), fBlockPos(1,0),fBlockSize()
{
	Initialize(blocksize);
}